

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O2

size_t __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::available
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this)

{
  size_t sVar1;
  error_code ec;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = detail::socket_ops::available
                    ((this->impl_).implementation_.super_base_implementation_type.socket_,&local_20)
  ;
  detail::throw_error(&local_20,"available");
  return sVar1;
}

Assistant:

std::size_t available() const
  {
    asio::error_code ec;
    std::size_t s = impl_.get_service().available(
        impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "available");
    return s;
  }